

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite_modern_cpp.h
# Opt level: O1

void __thiscall sqlite::database::database(database *this,string *db_name,sqlite_config *config)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  int iVar4;
  undefined8 extraout_RAX;
  char *pcVar5;
  str_ref sql;
  str_ref sql_00;
  sqlite3 *tmp;
  element_type *local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_60;
  element_type *local_50;
  database_binder local_48;
  
  (this->_db).super___shared_ptr<sqlite3,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->_db).super___shared_ptr<sqlite3,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_50 = (element_type *)0x0;
  pcVar5 = config->zVfs;
  iVar4 = sqlite3_open_v2((db_name->_M_dataplus)._M_p,&local_50,config->flags);
  local_68 = local_50;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<sqlite3*,sqlite::database::database(std::__cxx11::string_const&,sqlite::sqlite_config_const&)::_lambda(sqlite3*)_1_,std::allocator<void>,void>
            ();
  p_Var3 = p_Stack_60;
  peVar2 = local_68;
  local_68 = (element_type *)0x0;
  p_Stack_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (this->_db).super___shared_ptr<sqlite3,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->_db).super___shared_ptr<sqlite3,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
  (this->_db).super___shared_ptr<sqlite3,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var3;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  if (p_Stack_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_60);
  }
  if (iVar4 == 0) {
    sqlite3_extended_result_codes
              ((this->_db).super___shared_ptr<sqlite3,_(__gnu_cxx::_Lock_policy)2>._M_ptr,1);
    if (config->encoding == UTF16) {
      sql._M_str = "PRAGMA encoding = \"UTF-16\";";
      sql._M_len = 0x1b;
      operator<<(&local_48,this,sql);
      database_binder::~database_binder(&local_48);
    }
    return;
  }
  if ((this->_db).super___shared_ptr<sqlite3,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    iVar4 = sqlite3_extended_errcode();
  }
  local_68 = (element_type *)CONCAT44(local_68._4_4_,iVar4);
  sql_00._M_str = pcVar5;
  sql_00._M_len = (size_t)"";
  errors::throw_sqlite_error((errors *)&local_68,(int *)0x0,sql_00);
  p_Var1 = (this->_db).super___shared_ptr<sqlite3,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

database(const std::string &db_name, const sqlite_config &config = {}): _db(nullptr) {
			sqlite3* tmp = nullptr;
			auto ret = sqlite3_open_v2(db_name.data(), &tmp, static_cast<int>(config.flags), config.zVfs);
			_db = std::shared_ptr<sqlite3>(tmp, [=](sqlite3* ptr) { sqlite3_close_v2(ptr); }); // this will close the connection eventually when no longer needed.
			if(ret != SQLITE_OK) errors::throw_sqlite_error(_db ? sqlite3_extended_errcode(_db.get()) : ret);
			sqlite3_extended_result_codes(_db.get(), true);
			if(config.encoding == Encoding::UTF16)
				*this << R"(PRAGMA encoding = "UTF-16";)";
		}